

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.c
# Opt level: O2

void calc_scalar(rt_function_t *f,float value,_func_float_float_float *calc_func)

{
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  rt_list_t shape;
  
  shape._4_4_ = 0;
  shape.size = ((*f->outputs)->shape).size;
  shape.data = ((*f->outputs)->shape).data;
  uVar3 = calc_shape_size(shape);
  pvVar1 = (*f->inputs)->data;
  pvVar2 = (*f->outputs)->data;
  uVar4 = 0;
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    fVar6 = (*calc_func)(*(float *)((long)pvVar1 + uVar4 * 4),value);
    *(float *)((long)pvVar2 + uVar4 * 4) = fVar6;
  }
  return;
}

Assistant:

void calc_scalar(rt_function_t *f, float value,
                 float (*calc_func)(float, float)) {
  int out_size = calc_shape_size(f->outputs[0]->shape);
  float *input = f->inputs[0]->data;
  float *output = f->outputs[0]->data;
  int i; // Iterator
  for (i = 0; i < out_size; i++) {
    output[i] = calc_func(input[i], value);
  }
}